

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGImpactShape.cpp
# Opt level: O2

void __thiscall
btGImpactMeshShapePart::processAllTrianglesRay
          (btGImpactMeshShapePart *this,btTriangleCallback *callback,btVector3 *rayFrom,
          btVector3 *rayTo)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  btAlignedObjectArray<int> collided;
  btVector3 rayDir;
  btPrimitiveTriangle triangle;
  btAlignedObjectArray<int> local_a0;
  btVector3 local_80;
  btPrimitiveTriangle local_70;
  
  (*(this->super_btGImpactShapeInterface).super_btConcaveShape.super_btCollisionShape.
    _vptr_btCollisionShape[0x1c])();
  local_a0.m_ownsMemory = true;
  local_a0.m_data = (int *)0x0;
  local_a0.m_size = 0;
  local_a0.m_capacity = 0;
  local_80 = operator-(rayTo,rayFrom);
  btVector3::normalize(&local_80);
  btGImpactQuantizedBvh::rayQuery
            (&(this->super_btGImpactShapeInterface).m_box_set,&local_80,rayFrom,&local_a0);
  lVar2 = (long)local_a0.m_size;
  if (lVar2 == 0) {
    (*(this->super_btGImpactShapeInterface).super_btConcaveShape.super_btCollisionShape.
      _vptr_btCollisionShape[0x1d])(this);
  }
  else {
    uVar1 = *(uint *)&this->field_0xe0;
    local_70.m_margin = 0.01;
    while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
      btGImpactShapeInterface::getPrimitiveTriangle
                (&this->super_btGImpactShapeInterface,local_a0.m_data[lVar2],&local_70);
      (*callback->_vptr_btTriangleCallback[2])
                (callback,&local_70,(ulong)uVar1,(ulong)(uint)local_a0.m_data[lVar2]);
    }
    (*(this->super_btGImpactShapeInterface).super_btConcaveShape.super_btCollisionShape.
      _vptr_btCollisionShape[0x1d])(this);
  }
  btAlignedObjectArray<int>::~btAlignedObjectArray(&local_a0);
  return;
}

Assistant:

void btGImpactMeshShapePart::processAllTrianglesRay(btTriangleCallback* callback,const btVector3& rayFrom, const btVector3& rayTo) const
{
	lockChildShapes();

	btAlignedObjectArray<int> collided;
	btVector3 rayDir(rayTo - rayFrom);
	rayDir.normalize();
	m_box_set.rayQuery(rayDir, rayFrom, collided);

	if(collided.size()==0)
	{
		unlockChildShapes();
		return;
	}

	int part = (int)getPart();
	btPrimitiveTriangle triangle;
	int i = collided.size();
	while(i--)
	{
		getPrimitiveTriangle(collided[i],triangle);
		callback->processTriangle(triangle.m_vertices,part,collided[i]);
	}
	unlockChildShapes();
}